

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

bool __thiscall doublechecked::Roaring::contains(Roaring *this,uint32_t x)

{
  bool bVar1;
  const_iterator cVar2;
  uint32_t local_1c;
  
  local_1c = x;
  bVar1 = roaring::Roaring::contains(&this->plain,x);
  cVar2 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::find(&(this->check)._M_t,&local_1c);
  _assert_true((ulong)(((_Rb_tree_header *)cVar2._M_node ==
                       &(this->check)._M_t._M_impl.super__Rb_tree_header) != bVar1),
               "ans == (check.find(x) != check.end())",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0xad);
  return bVar1;
}

Assistant:

bool contains(uint32_t x) const {
        bool ans = plain.contains(x);
        assert_true(ans == (check.find(x) != check.end()));
        return ans;
    }